

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_widget::render(base_widget *this,form_context *context)

{
  bool bVar1;
  html_list_type hVar2;
  ulong uVar3;
  escape *this_00;
  ostream *poVar4;
  form_context *in_RSI;
  base_widget *in_RDI;
  html_list_type type;
  ostream *output;
  base_widget *in_stack_fffffffffffffc08;
  basic_message<char> *in_stack_fffffffffffffc10;
  streamable *in_stack_fffffffffffffc18;
  escape *in_stack_fffffffffffffc20;
  basic_message<char> *in_stack_fffffffffffffc28;
  basic_message<char> *ptr;
  streamable *in_stack_fffffffffffffc30;
  form_context *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffd08;
  base_widget *in_stack_fffffffffffffd10;
  streamable local_228 [6];
  streamable local_160 [2];
  string local_118 [176];
  streamable local_68 [2];
  html_list_type local_1c;
  streamable *local_18;
  form_context *local_10;
  
  local_10 = in_RSI;
  auto_generate(in_stack_fffffffffffffd10,(form_context *)in_stack_fffffffffffffd08);
  local_18 = (streamable *)form_context::out(in_stack_fffffffffffffc50);
  local_1c = form_context::html_list(local_10);
  switch(local_1c) {
  case as_p:
    std::operator<<((ostream *)local_18,"<p>");
    break;
  case as_table:
    std::operator<<((ostream *)local_18,"<tr><th>");
    break;
  case as_ul:
    std::operator<<((ostream *)local_18,"<li>");
    break;
  case as_dl:
    std::operator<<((ostream *)local_18,"<dt>");
  }
  bVar1 = has_message(in_RDI);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)local_18,"<label for=\"");
      id_abi_cxx11_(in_stack_fffffffffffffc08);
      poVar4 = std::operator<<(poVar4,local_118);
      std::operator<<(poVar4,"\">");
      message(in_stack_fffffffffffffc08);
      filters::streamable::streamable<booster::locale::basic_message<char>>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      filters::escape::escape(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      poVar4 = filters::operator<<((ostream *)in_stack_fffffffffffffc10,
                                   (escape *)in_stack_fffffffffffffc08);
      std::operator<<(poVar4,"</label>");
      filters::escape::~escape((escape *)in_stack_fffffffffffffc10);
      filters::streamable::~streamable(local_160);
      booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_118);
    }
    else {
      message(in_stack_fffffffffffffc08);
      filters::streamable::streamable<booster::locale::basic_message<char>>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      filters::escape::escape(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      filters::operator<<((ostream *)in_stack_fffffffffffffc10,(escape *)in_stack_fffffffffffffc08);
      filters::escape::~escape((escape *)in_stack_fffffffffffffc10);
      filters::streamable::~streamable(local_68);
      booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffc10);
    }
    if ((local_1c != as_table) && (local_1c != as_dl)) {
      std::operator<<((ostream *)local_18,"&nbsp;");
    }
  }
  else if (local_1c == as_table) {
    std::operator<<((ostream *)local_18,"&nbsp;");
  }
  hVar2 = form_context::html_list(local_10);
  if (hVar2 == as_table) {
    std::operator<<((ostream *)local_18,"</th><td>");
  }
  else if (hVar2 == as_dl) {
    std::operator<<((ostream *)local_18,"</dt><dd>");
  }
  bVar1 = valid(in_RDI);
  if (bVar1) {
    if (local_1c == as_table) {
      std::operator<<((ostream *)local_18,"&nbsp;");
    }
  }
  else {
    std::operator<<((ostream *)local_18,"<span class=\"cppcms_form_error\">");
    bVar1 = has_error_message(in_RDI);
    if (bVar1) {
      in_stack_fffffffffffffc30 = local_18;
      error_message(in_stack_fffffffffffffc08);
      filters::streamable::streamable<booster::locale::basic_message<char>>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      filters::escape::escape(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      filters::operator<<((ostream *)in_stack_fffffffffffffc10,(escape *)in_stack_fffffffffffffc08);
      filters::escape::~escape((escape *)in_stack_fffffffffffffc10);
      filters::streamable::~streamable(local_228);
      booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffc10);
    }
    else {
      std::operator<<((ostream *)local_18,"*");
    }
    std::operator<<((ostream *)local_18,"</span> ");
  }
  std::operator<<((ostream *)local_18,"<span class=\"cppcms_form_input\">");
  form_context::widget_part(local_10,first_part);
  (*(in_RDI->super_base_form)._vptr_base_form[8])(in_RDI,local_10);
  std::operator<<((ostream *)local_18,(string *)&in_RDI->attr_);
  form_context::widget_part(local_10,second_part);
  (*(in_RDI->super_base_form)._vptr_base_form[8])(in_RDI,local_10);
  std::operator<<((ostream *)local_18,"</span>");
  bVar1 = has_help(in_RDI);
  if (bVar1) {
    this_00 = (escape *)std::operator<<((ostream *)local_18,"<span class=\"cppcms_form_help\">");
    ptr = (basic_message<char> *)&stack0xfffffffffffffc90;
    help(in_stack_fffffffffffffc08);
    filters::streamable::streamable<booster::locale::basic_message<char>>
              (in_stack_fffffffffffffc30,ptr);
    filters::escape::escape(this_00,in_stack_fffffffffffffc18);
    poVar4 = filters::operator<<((ostream *)in_stack_fffffffffffffc10,
                                 (escape *)in_stack_fffffffffffffc08);
    std::operator<<(poVar4,"</span>");
    filters::escape::~escape((escape *)in_stack_fffffffffffffc10);
    filters::streamable::~streamable((streamable *)&stack0xfffffffffffffd10);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffffc10);
  }
  hVar2 = form_context::html_list(local_10);
  switch(hVar2) {
  case as_p:
    std::operator<<((ostream *)local_18,"</p>\n");
    break;
  case as_table:
    std::operator<<((ostream *)local_18,"</td></tr>\n");
    break;
  case as_ul:
    std::operator<<((ostream *)local_18,"</li>\n");
    break;
  case as_dl:
    std::operator<<((ostream *)local_18,"</dd>\n");
    break;
  case as_space:
    std::operator<<((ostream *)local_18,"\n");
  }
  return;
}

Assistant:

void base_widget::render(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	html_list_type type = context.html_list();
	switch(type) {
	case as_p: output<<"<p>"; break;
	case as_table: output<<"<tr><th>"; break;
	case as_ul: output<<"<li>"; break;
	case as_dl: output<<"<dt>"; break;
	default: ;
	}
	
	if(has_message()) {
		if(id_.empty())
			output << filters::escape(message());
		else
			output<<"<label for=\"" << id() << "\">" << filters::escape(message()) <<"</label>";
		if(type!=as_table && type!=as_dl)
			output << "&nbsp;";
	}
	else if(type == as_table) {
		output<<"&nbsp;";
	}
	switch(context.html_list()) {
	case as_table: output<<"</th><td>"; break;
	case as_dl: output<<"</dt><dd>"; break;
	default: ;
	}

	if(!valid()) {
		output<<"<span class=\"cppcms_form_error\">";
		if(has_error_message())
			output<<filters::escape(error_message());
		else
			output<<"*";
		output<<"</span> ";
	}
	else if(type == as_table){
		output<<"&nbsp;";
	}
	output<<"<span class=\"cppcms_form_input\">";
	context.widget_part(first_part);
	render_input(context);
	output<<attr_;
	context.widget_part(second_part);
	render_input(context);
	output<<"</span>";

	if(has_help()) {
		output<<"<span class=\"cppcms_form_help\">"<<filters::escape(help())<<"</span>";
	}
		
	switch(context.html_list()) {
	case as_p: output<<"</p>\n"; break;
	case as_table: output<<"</td></tr>\n"; break;
	case as_ul: output<<"</li>\n"; break;
	case as_dl: output<<"</dd>\n"; break;
	case as_space: output<<"\n";
	default: ;
	}
}